

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

border_theme * border_theme_create(void)

{
  border_theme *theme;
  
  theme = (border_theme *)malloc(8);
  if (theme == (border_theme *)0x0) {
    theme = (border_theme *)0x0;
  }
  else {
    theme->unfocused = 1;
    theme->focused = 1;
    theme->urgent = 1;
    theme->sticky = 1;
  }
  return theme;
}

Assistant:

struct border_theme *border_theme_create(void)
{
        struct border_theme *theme = malloc(sizeof(struct border_theme));

        if (theme == NULL) {
                return NULL;
        }

        theme->unfocused = DEFAULT_BORDER_WIDTH;
        theme->focused = DEFAULT_BORDER_WIDTH;
        theme->urgent = DEFAULT_BORDER_WIDTH;
        theme->sticky = DEFAULT_BORDER_WIDTH;

        return theme;
}